

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

ValueEntry * __thiscall rsg::VariableManager::getValue(VariableManager *this,Variable *variable)

{
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var1;
  ValueEntry *pVVar2;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const*const*,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                    ((this->m_entryCache).
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_entryCache).
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pVVar2 = (ValueEntry *)0x0;
  }
  else {
    pVVar2 = *_Var1._M_current;
  }
  return pVVar2;
}

Assistant:

const ValueEntry* VariableManager::getValue (const Variable* variable) const
{
	vector<const ValueEntry*>::const_iterator pos = std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));
	return pos != m_entryCache.end() ? *pos : DE_NULL;
}